

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O0

bool mg::data::nxgx_decompress(Nxx *header,uint8_t *data,string *out)

{
  int iVar1;
  uint uVar2;
  int err_2;
  int err;
  int err_1;
  z_stream istream;
  string *out_local;
  uint8_t *data_local;
  Nxx *header_local;
  
  istream.reserved = (uLong)out;
  std::__cxx11::string::resize((ulong)out);
  memset(&err,0,0x70);
  istream.next_in._0_4_ = header->compressed_size;
  istream.next_out._0_4_ = header->size;
  _err = data;
  istream.total_in = std::__cxx11::string::data();
  istream.avail_out = 0;
  istream._36_4_ = 0;
  iVar1 = inflateInit2_(&err,0x1f,"1.2.11",0x70);
  if ((iVar1 != 0) == 0) {
    uVar2 = inflate(&err,2);
    if ((uVar2 == 0) || (uVar2 == 1)) {
      iVar1 = inflateEnd(&err);
      if ((iVar1 != 0) == 0) {
        header_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"zlib error: %d: %s\n",(ulong)(uint)(iVar1 != 0),istream.total_out);
        header_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"zlib error: %d: %s\n",(ulong)uVar2,istream.total_out);
      header_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"zlib error: %d: %s\n",(ulong)(uint)(iVar1 != 0),istream.total_out);
    header_local._7_1_ = false;
  }
  return header_local._7_1_;
}

Assistant:

bool nxgx_decompress(const Nxx &header, const uint8_t *data, std::string &out) {
  // Expand output to hold data
  out.resize(header.size);

  // Create inflate stream
  z_stream istream{};
  istream.avail_in = header.compressed_size;
  istream.next_in = const_cast<uint8_t *>(data);
  istream.avail_out = header.size;
  istream.next_out = reinterpret_cast<uint8_t *>(out.data());
  istream.total_out = 0;

  // Init inflate context
  if (int err = inflateInit2(&istream, 16 + MAX_WBITS) != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  // Perform inflation
  const int err = inflate(&istream, Z_SYNC_FLUSH);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  if (int err = inflateEnd(&istream) != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  return true;
}